

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void wl_registry_handle_global
               (void *data,wl_registry *registry,uint name,char *interface,uint version)

{
  int iVar1;
  void *pvVar2;
  wl_data *wl_data;
  uint version_local;
  char *interface_local;
  uint name_local;
  wl_registry *registry_local;
  void *data_local;
  
  iVar1 = strcmp(interface,"wl_output");
  if (iVar1 == 0) {
    pvVar2 = wl_registry_bind(registry,name,(wl_interface *)&wl_output_interface,1);
    *(void **)((long)data + 0x10) = pvVar2;
    wl_output_add_listener(*(wl_output **)((long)data + 0x10),&wl_output_listener,data);
  }
  else {
    iVar1 = strcmp(interface,"wl_compositor");
    if (iVar1 == 0) {
      pvVar2 = wl_registry_bind(registry,name,(wl_interface *)&wl_compositor_interface,1);
      *(void **)((long)data + 0x18) = pvVar2;
    }
    else {
      iVar1 = strcmp(interface,"wl_shell");
      if (iVar1 == 0) {
        pvVar2 = wl_registry_bind(registry,name,(wl_interface *)&wl_shell_interface,1);
        *(void **)((long)data + 0x20) = pvVar2;
      }
      else {
        iVar1 = strcmp(interface,"wl_seat");
        if (iVar1 == 0) {
          pvVar2 = wl_registry_bind(registry,name,(wl_interface *)&wl_seat_interface,1);
          *(void **)((long)data + 0x28) = pvVar2;
          wl_seat_add_listener(*(wl_seat **)((long)data + 0x28),&wl_seat_listener,data);
        }
      }
    }
  }
  return;
}

Assistant:

static void wl_registry_handle_global(void *data, struct wl_registry *registry, unsigned int name, const char *interface, unsigned int version)
{
  struct wl_data *wl_data = data;

  if (!strcmp(interface, "wl_output")) {
    wl_data->wl_output = wl_registry_bind(registry, name, &wl_output_interface, 1);
    wl_output_add_listener(wl_data->wl_output, &wl_output_listener, wl_data);
  }
  else if (!strcmp(interface, "wl_compositor")) {
    wl_data->wl_compositor = wl_registry_bind(registry, name, &wl_compositor_interface, 1);
  }
  else if (!strcmp(interface, "wl_shell")) {
    wl_data->wl_shell = wl_registry_bind(registry, name, &wl_shell_interface, 1);
  }
  else if (!strcmp(interface, "wl_seat")) {
    wl_data->wl_seat = wl_registry_bind(registry, name, &wl_seat_interface, 1);
    wl_seat_add_listener(wl_data->wl_seat, &wl_seat_listener, wl_data);
  }
}